

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O2

Stats * __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:139:30)>_>
::run(Stats *__return_storage_ptr__,
     Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:139:30)>_>
     *this,PathList *pathList,Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results,
     size_t depth)

{
  Results *pRVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  bool bVar4;
  value_type *top;
  pointer pSVar5;
  pointer pSVar6;
  ulong uVar7;
  uint64_t uVar8;
  size_t sVar9;
  uint64_t uVar10;
  string *psVar11;
  bool result_d;
  bool result_c;
  bool result_b;
  bool result_a;
  bool result_d_1;
  bool result_c_1;
  bool result_b_1;
  bool result_a_1;
  allocator local_401 [9];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  size_type local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  VectorF vec_d;
  VectorF vec_c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a8;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  size_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  string local_368;
  VectorF local_348;
  uint64_t uStack_340;
  ContextResultsRecorder *local_330;
  string *local_328;
  Stats *local_320;
  NameStack *local_318;
  undefined1 local_310 [16];
  uint64_t uStack_300;
  undefined1 local_2f8 [16];
  uint64_t local_2e8;
  VectorF vec_b;
  VectorF vec_a;
  Finally local_2d0;
  Finally stack;
  Finally stack_1;
  string local_2a0;
  WhenRunner local_280;
  StackElement local_1e8;
  StackElement local_1d8;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>
  local_1c0;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>
  local_170;
  UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>
  local_120;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>
  local_c0;
  string local_50;
  
  psVar11 = &this->name;
  pRVar1 = ((results.value)->results_).value;
  local_318 = &(results.value)->contextStack_;
  (*pRVar1->_vptr_Results[5])(pRVar1,local_318,psVar11);
  __return_storage_ptr__->checks_ = 0;
  __return_storage_ptr__->failedTests_ = 0;
  __return_storage_ptr__->fixtures_ = 0;
  __return_storage_ptr__->tests_ = 0;
  __return_storage_ptr__->failedChecks_ = 0;
  bVar4 = included(this,pathList,depth);
  if (bVar4) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)psVar11);
    WhenRunner::WhenRunner(&local_280,results,&local_50);
    local_330 = results.value;
    local_328 = psVar11;
    local_320 = __return_storage_ptr__;
    ::std::__cxx11::string::~string((string *)&local_50);
    if (local_280.whenStack.
        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_280.whenStack.
        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_280.whenStack.
      super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_280.whenStack.
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    local_280.whenDepth_ = 0;
    local_348.x = 20.0;
    local_348.y = 50.0;
    pSVar5 = local_280.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = local_280.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_280.stats_.fixtures_ = local_280.stats_.fixtures_ + 1;
    do {
      for (; pSVar6 != pSVar5; pSVar6 = pSVar6 + 1) {
        pSVar6->current = 0;
      }
      local_310._0_8_ = &local_280;
      local_2f8 = (undefined1  [16])0x0;
      stack0xfffffffffffffcf8 = (undefined1  [16])0x0;
      local_2e8 = 0;
      vec_a.x = 1.0;
      vec_a.y = 50.0;
      vec_b.x = 1.0;
      vec_b.y = 50.0;
      vec_c = local_348;
      vec_d.x = 1.0;
      vec_d.y = -50.0;
      ::std::__cxx11::string::string((string *)&local_388,"they are same",local_401);
      uVar2 = local_310._0_8_;
      local_3f0 = local_380;
      local_3f8 = &local_3e8;
      if (local_388 == &local_378) {
        local_3e8._8_8_ = local_378._8_8_;
      }
      else {
        local_3f8 = local_388;
      }
      local_3e8._M_allocated_capacity._1_7_ = local_378._M_allocated_capacity._1_7_;
      local_3e8._M_local_buf[0] = local_378._M_local_buf[0];
      local_380 = 0;
      local_378._M_local_buf[0] = '\0';
      pSVar5 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                  *)(local_310._0_8_ + 0x30))->
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = *(size_t *)(local_310._0_8_ + 0x90);
      local_388 = &local_378;
      if ((ulong)((long)(((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                           *)(local_310._0_8_ + 0x30))->
                        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 4) <= uVar7) {
        local_1e8.index = 0;
        local_1e8.current = 0;
        std::
        vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ::emplace_back<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                  ((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                    *)(local_310._0_8_ + 0x30),&local_1e8);
        pSVar5 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                    *)(uVar2 + 0x30))->
                 super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = *(size_t *)(uVar2 + 0x90);
      }
      stack.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      *(undefined ***)
       stack.functor._M_t.
       super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       ._M_t.
       super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           &PTR__BaseFunctor_00179360;
      *(undefined8 *)
       ((long)stack.functor._M_t.
              super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              ._M_t.
              super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
              _M_head_impl + 8) = uVar2;
      stack.valid = true;
      if (pSVar5[uVar7].index == pSVar5[uVar7].current) {
        *(ulong *)(uVar2 + 0x90) = uVar7 + 1;
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        if (local_3f8 == &local_3e8) {
          local_368.field_2._8_8_ = local_3e8._8_8_;
        }
        else {
          local_368._M_dataplus._M_p = (pointer)local_3f8;
        }
        local_368.field_2._M_allocated_capacity = local_3e8._M_allocated_capacity;
        local_368._M_string_length = local_3f0;
        local_3f0 = 0;
        local_3e8._M_allocated_capacity = local_3e8._M_allocated_capacity & 0xffffffffffffff00;
        local_3f8 = &local_3e8;
        WhenResultRecorder::push((WhenResultRecorder *)(uVar2 + 0x48),&local_368);
        ::std::__cxx11::string::~string((string *)&local_368);
        local_2d0.functor._M_t.
        super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        ._M_t.
        super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
              )operator_new(0x10);
        *(undefined ***)
         local_2d0.functor._M_t.
         super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         ._M_t.
         super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             &PTR__BaseFunctor_001793a0;
        ((BaseFunctor *)
        ((long)local_2d0.functor._M_t.
               super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               ._M_t.
               super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
               _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)uVar2;
        local_2d0.valid = true;
        result_a = exma::vector::operator==(&vec_a,&vec_a);
        result_b = exma::vector::operator==(&vec_a,&vec_b);
        result_c = exma::vector::operator!=(&vec_a,&vec_b);
        result_d = exma::vector::operator!=(&vec_a,&vec_b);
        local_1c0.lhs.variableName = "result_a";
        local_1c0.lhs.value = &result_a;
        local_1c0.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_1c0.lhs.line = 0x9a;
        local_1c0.rhs.variableName = "result_b";
        local_1c0.rhs.value = &result_b;
        local_1c0.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_1c0.rhs.line = 0x9a;
        local_1c0.operatorName = "&&";
        Check::
        operator()<const_char_(&)[17],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>
                  ((Check *)local_310,(char (*) [17])"true is returned",&local_1c0);
        local_120.arg.operatorName = "&&";
        local_120.arg.lhs.variableName = "result_c";
        local_120.arg.lhs.value = &result_c;
        local_120.arg.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_120.arg.lhs.line = 0x9c;
        local_120.arg.rhs.variableName = "result_d";
        local_120.arg.rhs.value = &result_d;
        local_120.arg.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_120.arg.rhs.line = 0x9c;
        local_120.operatorName = "!";
        Check::
        operator()<const_char_(&)[18],_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>_>
                  ((Check *)local_310,(char (*) [18])"false is returned",&local_120);
        Enhedron::Impl::Util::Finally::~Finally(&local_2d0);
      }
      Enhedron::Impl::Util::Finally::~Finally(&stack);
      ::std::__cxx11::string::~string((string *)&local_3f8);
      ::std::__cxx11::string::~string((string *)&local_388);
      ::std::__cxx11::string::string
                ((string *)&local_3a8,"at least one component is different",(allocator *)&local_3f8)
      ;
      uVar2 = local_310._0_8_;
      local_3d0 = local_3a0;
      local_3d8 = &local_3c8;
      if (local_3a8 == &local_398) {
        local_3c8._8_8_ = local_398._8_8_;
      }
      else {
        local_3d8 = local_3a8;
      }
      local_3c8._M_allocated_capacity._1_7_ = local_398._M_allocated_capacity._1_7_;
      local_3c8._M_local_buf[0] = local_398._M_local_buf[0];
      local_3a0 = 0;
      local_398._M_local_buf[0] = '\0';
      pSVar5 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                  *)(local_310._0_8_ + 0x30))->
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = *(size_t *)(local_310._0_8_ + 0x90);
      local_3a8 = &local_398;
      if ((ulong)((long)(((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                           *)(local_310._0_8_ + 0x30))->
                        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 4) <= uVar7) {
        local_1d8.index = 0;
        local_1d8.current = 0;
        std::
        vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ::emplace_back<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                  ((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                    *)(local_310._0_8_ + 0x30),&local_1d8);
        pSVar5 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                    *)(uVar2 + 0x30))->
                 super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = *(size_t *)(uVar2 + 0x90);
      }
      stack_1.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      *(undefined ***)
       stack_1.functor._M_t.
       super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       ._M_t.
       super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           &PTR__BaseFunctor_001793e0;
      *(undefined8 *)
       ((long)stack_1.functor._M_t.
              super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              ._M_t.
              super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
              _M_head_impl + 8) = uVar2;
      stack_1.valid = true;
      if (pSVar5[uVar7].index == pSVar5[uVar7].current) {
        *(ulong *)(uVar2 + 0x90) = uVar7 + 1;
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        if (local_3d8 == &local_3c8) {
          local_2a0.field_2._8_8_ = local_3c8._8_8_;
        }
        else {
          local_2a0._M_dataplus._M_p = (pointer)local_3d8;
        }
        local_2a0.field_2._M_allocated_capacity = local_3c8._M_allocated_capacity;
        local_2a0._M_string_length = local_3d0;
        local_3d0 = 0;
        local_3c8._M_allocated_capacity = local_3c8._M_allocated_capacity & 0xffffffffffffff00;
        local_3d8 = &local_3c8;
        WhenResultRecorder::push((WhenResultRecorder *)(uVar2 + 0x48),&local_2a0);
        ::std::__cxx11::string::~string((string *)&local_2a0);
        local_368._M_dataplus._M_p = (pointer)operator_new(0x10);
        *(undefined ***)local_368._M_dataplus._M_p = &PTR__BaseFunctor_00179420;
        *(undefined8 *)(local_368._M_dataplus._M_p + 8) = uVar2;
        local_368._M_string_length = CONCAT71(local_368._M_string_length._1_7_,1);
        result_a_1 = exma::vector::operator==(&vec_a,&vec_c);
        result_b_1 = exma::vector::operator==(&vec_a,&vec_d);
        result_c_1 = exma::vector::operator!=(&vec_a,&vec_c);
        result_d_1 = exma::vector::operator!=(&vec_a,&vec_d);
        local_c0.lhs.operatorName = "!";
        local_c0.lhs.arg.variableName = "result_a";
        local_c0.lhs.arg.value = &result_a_1;
        local_c0.lhs.arg.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_c0.lhs.arg.line = 0xa7;
        local_c0.rhs.operatorName = "!";
        local_c0.rhs.arg.variableName = "result_b";
        local_c0.rhs.arg.value = &result_b_1;
        local_c0.rhs.arg.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_c0.rhs.arg.line = 0xa7;
        local_c0.operatorName = "&&";
        Check::
        operator()<const_char_(&)[18],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>_>
                  ((Check *)local_310,(char (*) [18])"false is returned",&local_c0);
        local_170.lhs.variableName = "result_c";
        local_170.lhs.value = &result_c_1;
        local_170.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_170.lhs.line = 0xa9;
        local_170.rhs.variableName = "result_d";
        local_170.rhs.value = &result_d_1;
        local_170.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_170.rhs.line = 0xa9;
        local_170.operatorName = "&&";
        Check::
        operator()<const_char_(&)[17],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>
                  ((Check *)local_310,(char (*) [17])"true is returned",&local_170);
        Enhedron::Impl::Util::Finally::~Finally((Finally *)&local_368);
      }
      Enhedron::Impl::Util::Finally::~Finally(&stack_1);
      ::std::__cxx11::string::~string((string *)&local_3d8);
      ::std::__cxx11::string::~string((string *)&local_3a8);
      psVar11 = local_328;
      pSVar6 = local_280.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        local_280.whenStack.
        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar6;
        pSVar6 = local_280.whenStack.
                 super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        pSVar5 = local_280.whenStack.
                 super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_280.whenStack.
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_280.whenStack.
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_start) goto LAB_0014476e;
        sVar9 = pSVar6->index + 1;
      } while (local_280.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].current == sVar9);
      pSVar6->index = sVar9;
      pSVar5 = local_280.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
LAB_0014476e:
      uVar10 = local_280.stats_.fixtures_ + local_310._8_8_;
      local_280.stats_.tests_ = local_280.stats_.tests_ + 1 + uStack_300;
      uVar8 = local_280.stats_.failedChecks_ + local_2e8;
      local_280.stats_.checks_ = local_280.stats_.checks_ + local_2f8._0_8_;
      uStack_340 = local_280.stats_.failedTests_ + local_2f8._8_8_;
      pSVar6 = local_280.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_280.stats_.fixtures_ = uVar10;
      local_280.stats_.failedTests_ = uStack_340;
      local_280.stats_.failedChecks_ = uVar8;
    } while (local_280.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_280.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_start);
    if (local_280.stats_.tests_ == 0) {
      local_280.stats_.tests_ = 1;
    }
    uVar3 = local_280.stats_.tests_;
    local_348 = (VectorF)local_280.stats_.checks_;
    WhenRunner::~WhenRunner(&local_280);
    local_320->fixtures_ = local_320->fixtures_ + uVar10;
    local_320->tests_ = local_320->tests_ + uVar3;
    local_320->checks_ = local_320->checks_ + (long)local_348;
    local_320->failedTests_ = local_320->failedTests_ + uStack_340;
    local_320->failedChecks_ = local_320->failedChecks_ + uVar8;
    results.value = local_330;
    __return_storage_ptr__ = local_320;
  }
  pRVar1 = ((results.value)->results_).value;
  (*pRVar1->_vptr_Results[6])(pRVar1,__return_storage_ptr__,local_318,psVar11);
  return __return_storage_ptr__;
}

Assistant:

virtual Stats run(const PathList& pathList, Out<ContextResultsRecorder> results, size_t depth) override {
            results->beginGiven(name);
            Stats stats;

            if (included(pathList, depth)) {
                stats += args.applyExtraBefore(runTest, name, results);
            }

            results->endGiven(stats, name);

            return stats;
        }